

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator=(ChFrameMoving<double> *this,ChFrame<double> *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((ChFrameMoving<double> *)other != this) {
    ChFrame<double>::operator=(&this->super_ChFrame<double>,other);
    if (this != (ChFrameMoving<double> *)&utils::ChProfileManager::CurrentNode) {
      (this->coord_dtdt).rot.m_data[0] = QNULL;
      (this->coord_dtdt).rot.m_data[1] = DAT_00b90958;
      (this->coord_dtdt).rot.m_data[2] = DAT_00b90960;
      (this->coord_dtdt).rot.m_data[3] = DAT_00b90968;
    }
    dVar1 = (this->coord_dtdt).rot.m_data[1];
    dVar2 = (this->coord_dtdt).rot.m_data[2];
    dVar3 = (this->coord_dtdt).rot.m_data[3];
    (this->coord_dt).rot.m_data[0] = (this->coord_dtdt).rot.m_data[0];
    (this->coord_dt).rot.m_data[1] = dVar1;
    (this->coord_dt).rot.m_data[2] = dVar2;
    (this->coord_dt).rot.m_data[3] = dVar3;
  }
  return this;
}

Assistant:

ChFrameMoving<Real>& operator=(const ChFrame<Real>& other) {
        if (&other == this)
            return *this;
        ChFrame<Real>::operator=(other);
        coord_dt.rot = coord_dtdt.rot = QNULL;
        return *this;
    }